

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O1

int Kit_DsdCheckVar4Dec2(Kit_DsdNtk_t *pNtk0,Kit_DsdNtk_t *pNtk1)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  Kit_DsdObj_t *pObj1;
  Kit_DsdObj_t *pObj0;
  
  if (pNtk0->nVars != 4) {
    __assert_fail("pNtk0->nVars == 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                  ,0x79f,"int Kit_DsdCheckVar4Dec2(Kit_DsdNtk_t *, Kit_DsdNtk_t *)");
  }
  if (pNtk1->nVars == 4) {
    iVar3 = Kit_DsdFindLargeBox_rec(pNtk0,(uint)(pNtk0->Root >> 1),2);
    if (iVar3 == 0) {
      iVar3 = Kit_DsdFindLargeBox_rec(pNtk1,(uint)(pNtk1->Root >> 1),2);
      if (iVar3 == 0) {
        uVar2 = pNtk0->Root >> 1;
        uVar1 = pNtk0->nVars;
        if ((uint)uVar2 < (uint)pNtk0->nNodes + (uint)uVar1) {
          if (uVar2 < uVar1) {
            pObj0 = (Kit_DsdObj_t *)0x0;
          }
          else {
            pObj0 = pNtk0->pNodes[(ulong)(uint)uVar2 - (ulong)uVar1];
          }
          uVar2 = pNtk1->Root >> 1;
          uVar1 = pNtk1->nVars;
          if ((uint)uVar2 < (uint)pNtk1->nNodes + (uint)uVar1) {
            if (uVar2 < uVar1) {
              pObj1 = (Kit_DsdObj_t *)0x0;
            }
            else {
              pObj1 = pNtk1->pNodes[(ulong)(uint)uVar2 - (ulong)uVar1];
            }
            iVar3 = Kit_DsdRootNodeHasCommonVars(pObj0,pObj1);
            return iVar3;
          }
        }
        __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kit.h"
                      ,0x99,"Kit_DsdObj_t *Kit_DsdNtkObj(Kit_DsdNtk_t *, int)");
      }
    }
    return 0;
  }
  __assert_fail("pNtk1->nVars == 4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                ,0x7a0,"int Kit_DsdCheckVar4Dec2(Kit_DsdNtk_t *, Kit_DsdNtk_t *)");
}

Assistant:

int Kit_DsdCheckVar4Dec2( Kit_DsdNtk_t * pNtk0, Kit_DsdNtk_t * pNtk1 )
{
    assert( pNtk0->nVars == 4 );
    assert( pNtk1->nVars == 4 );
    if ( Kit_DsdFindLargeBox(pNtk0, 2) )
        return 0;
    if ( Kit_DsdFindLargeBox(pNtk1, 2) )
        return 0;
    return Kit_DsdRootNodeHasCommonVars( Kit_DsdNtkRoot(pNtk0), Kit_DsdNtkRoot(pNtk1) );
}